

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void plutovg_path_arc_to(plutovg_path_t *path,float rx,float ry,float angle,_Bool large_arc_flag,
                        _Bool sweep_flag,float x,float y)

{
  plutovg_path_element_t *ppVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar9;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar10;
  float cp1x;
  float y3;
  float x3;
  float cp2y;
  float cp2x;
  float cp1y;
  float y2;
  float x2;
  float y1;
  float x1;
  float dy;
  float dx;
  plutovg_matrix_t matrix;
  float local_e0;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  plutovg_matrix_t local_60;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  fVar10 = 0.0;
  local_c4 = 0.0;
  if (0 < path->num_points) {
    ppVar1 = (path->elements).data;
    lVar2 = (long)(path->elements).size;
    fVar10 = ppVar1[lVar2 + -1].point.x;
    local_c4 = *(float *)((long)ppVar1 + lVar2 * 8 + -4);
  }
  if ((((rx != 0.0) || (NAN(rx))) && ((ry != 0.0 || (NAN(ry))))) &&
     ((((fVar10 != x || (NAN(fVar10) || NAN(x))) || (local_c4 != y)) || (NAN(local_c4) || NAN(y)))))
  {
    uStack_84 = in_XMM0_Db ^ 0x80000000;
    uStack_80 = in_XMM0_Dc ^ 0x80000000;
    uStack_7c = in_XMM0_Dd ^ 0x80000000;
    local_88 = -rx;
    if (-rx <= rx) {
      local_88 = rx;
    }
    uStack_94 = in_XMM1_Db ^ 0x80000000;
    uStack_90 = in_XMM1_Dc ^ 0x80000000;
    uStack_8c = in_XMM1_Dd ^ 0x80000000;
    local_98 = -ry;
    if (-ry <= ry) {
      local_98 = ry;
    }
    local_64 = (fVar10 - x) * 0.5;
    local_68 = (local_c4 - y) * 0.5;
    local_48 = -angle;
    uStack_44 = in_XMM2_Db ^ 0x80000000;
    uStack_40 = in_XMM2_Dc ^ 0x80000000;
    uStack_3c = in_XMM2_Dd ^ 0x80000000;
    local_b8 = angle;
    plutovg_matrix_init_rotate(&local_60,local_48);
    plutovg_matrix_map(&local_60,local_64,local_68,&local_64,&local_68);
    fVar5 = (local_68 * local_68) / (local_98 * local_98) +
            (local_64 * local_64) / (local_88 * local_88);
    if (1.0 < fVar5) {
      fVar9 = SQRT(fVar5);
      fVar6 = fVar9;
      if (fVar5 < 0.0) {
        local_74 = fVar9;
        fVar6 = sqrtf(fVar5);
        fVar9 = sqrtf(fVar5);
      }
      local_88 = local_88 * fVar6;
      local_98 = local_98 * fVar9;
    }
    plutovg_matrix_init_scale(&local_60,1.0 / local_88,1.0 / local_98);
    plutovg_matrix_rotate(&local_60,local_48);
    plutovg_matrix_map(&local_60,fVar10,local_c4,&local_6c,&local_70);
    plutovg_matrix_map(&local_60,x,y,&local_9c,&local_a0);
    fVar6 = local_9c - local_6c;
    fVar9 = local_a0 - local_70;
    fVar5 = 1.0 / (fVar6 * fVar6 + fVar9 * fVar9) + -0.25;
    fVar10 = 0.0;
    if (0.0 <= fVar5) {
      fVar10 = fVar5;
    }
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    if (large_arc_flag == sweep_flag) {
      fVar10 = -fVar10;
    }
    fVar9 = (local_9c + local_6c) * 0.5 - fVar9 * fVar10;
    fVar5 = (local_a0 + local_70) * 0.5 + fVar6 * fVar10;
    fVar10 = atan2f(local_70 - fVar5,local_6c - fVar9);
    local_e0 = atan2f(local_a0 - fVar5,local_9c - fVar9);
    local_e0 = local_e0 - fVar10;
    if (0.0 <= local_e0 || !sweep_flag) {
      if (0.0 < local_e0 && !sweep_flag) {
        local_e0 = local_e0 + -6.2831855;
      }
    }
    else {
      local_e0 = local_e0 + 6.2831855;
    }
    plutovg_matrix_init_rotate(&local_60,local_b8);
    plutovg_matrix_scale(&local_60,local_88,local_98);
    fVar6 = ceilf(ABS(local_e0 / 1.5717964));
    iVar4 = (int)fVar6;
    if (0 < iVar4) {
      local_c4 = (float)iVar4;
      iVar3 = 0;
      do {
        fVar6 = (float)iVar3;
        iVar3 = iVar3 + 1;
        local_88 = (fVar6 * local_e0) / local_c4 + fVar10;
        local_b8 = ((float)iVar3 * local_e0) / local_c4 + fVar10;
        local_98 = tanf((local_b8 - local_88) * 0.25);
        local_98 = local_98 * 1.3333334;
        local_c8 = cosf(local_b8);
        local_c8 = local_c8 + fVar9;
        local_cc = sinf(local_b8);
        fVar8 = local_c8;
        local_cc = local_cc + fVar5;
        fVar7 = sinf(local_b8);
        fVar6 = local_cc;
        local_bc = fVar7 * local_98 + fVar8;
        fVar8 = cosf(local_b8);
        local_c0 = fVar6 - fVar8 * local_98;
        local_b8 = cosf(local_88);
        fVar6 = sinf(local_88);
        local_d0 = local_b8 - fVar6 * local_98;
        local_b8 = sinf(local_88);
        fVar6 = cosf(local_88);
        local_d0 = local_d0 + fVar9;
        local_a4 = local_98 * fVar6 + local_b8 + fVar5;
        plutovg_matrix_map(&local_60,local_d0,local_a4,&local_d0,&local_a4);
        plutovg_matrix_map(&local_60,local_bc,local_c0,&local_bc,&local_c0);
        plutovg_matrix_map(&local_60,local_c8,local_cc,&local_c8,&local_cc);
        plutovg_path_cubic_to(path,local_d0,local_a4,local_bc,local_c0,local_c8,local_cc);
      } while (iVar4 != iVar3);
    }
    return;
  }
  plutovg_path_line_to(path,x,y);
  return;
}

Assistant:

void plutovg_path_arc_to(plutovg_path_t* path, float rx, float ry, float angle, bool large_arc_flag, bool sweep_flag, float x, float y)
{
    float current_x, current_y;
    plutovg_path_get_current_point(path, &current_x, &current_y);
    if(rx == 0.f || ry == 0.f || (current_x == x && current_y == y)) {
        plutovg_path_line_to(path, x, y);
        return;
    }

    if(rx < 0.f) rx = -rx;
    if(ry < 0.f) ry = -ry;

    float dx = (current_x - x) * 0.5f;
    float dy = (current_y - y) * 0.5f;

    plutovg_matrix_t matrix;
    plutovg_matrix_init_rotate(&matrix, -angle);
    plutovg_matrix_map(&matrix, dx, dy, &dx, &dy);

    float rxrx = rx * rx;
    float ryry = ry * ry;
    float dxdx = dx * dx;
    float dydy = dy * dy;
    float radius = dxdx / rxrx + dydy / ryry;
    if(radius > 1.f) {
        rx *= sqrtf(radius);
        ry *= sqrtf(radius);
    }

    plutovg_matrix_init_scale(&matrix, 1.f / rx, 1.f / ry);
    plutovg_matrix_rotate(&matrix, -angle);

    float x1, y1;
    float x2, y2;
    plutovg_matrix_map(&matrix, current_x, current_y, &x1, &y1);
    plutovg_matrix_map(&matrix, x, y, &x2, &y2);

    float dx1 = x2 - x1;
    float dy1 = y2 - y1;
    float d = dx1 * dx1 + dy1 * dy1;
    float scale_sq = 1.f / d - 0.25f;
    if(scale_sq < 0.f) scale_sq = 0.f;
    float scale = sqrtf(scale_sq);
    if(sweep_flag == large_arc_flag)
        scale = -scale;
    dx1 *= scale;
    dy1 *= scale;

    float cx1 = 0.5f * (x1 + x2) - dy1;
    float cy1 = 0.5f * (y1 + y2) + dx1;

    float th1 = atan2f(y1 - cy1, x1 - cx1);
    float th2 = atan2f(y2 - cy1, x2 - cx1);
    float th_arc = th2 - th1;
    if(th_arc < 0.f && sweep_flag)
        th_arc += PLUTOVG_TWO_PI;
    else if(th_arc > 0.f && !sweep_flag)
        th_arc -= PLUTOVG_TWO_PI;
    plutovg_matrix_init_rotate(&matrix, angle);
    plutovg_matrix_scale(&matrix, rx, ry);
    int segments = (int)(ceilf(fabsf(th_arc / (PLUTOVG_HALF_PI + 0.001f))));
    for(int i = 0; i < segments; i++) {
        float th_start = th1 + i * th_arc / segments;
        float th_end = th1 + (i + 1) * th_arc / segments;
        float t = (8.f / 6.f) * tanf(0.25f * (th_end - th_start));

        float x3 = cosf(th_end) + cx1;
        float y3 = sinf(th_end) + cy1;

        float cp2x = x3 + t * sinf(th_end);
        float cp2y = y3 - t * cosf(th_end);

        float cp1x = cosf(th_start) - t * sinf(th_start);
        float cp1y = sinf(th_start) + t * cosf(th_start);

        cp1x += cx1;
        cp1y += cy1;

        plutovg_matrix_map(&matrix, cp1x, cp1y, &cp1x, &cp1y);
        plutovg_matrix_map(&matrix, cp2x, cp2y, &cp2x, &cp2y);
        plutovg_matrix_map(&matrix, x3, y3, &x3, &y3);

        plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, x3, y3);
    }
}